

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString VStringFromFormat(char *format,__va_list_tag *args)

{
  uint uVar1;
  char *otherBuffer;
  __va_list_tag *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  SimpleString SVar3;
  SimpleString SStack_c8;
  va_list argsCopy;
  char defaultBuffer [100];
  
  argsCopy[0].reg_save_area = in_RDX->reg_save_area;
  argsCopy[0].gp_offset = in_RDX->gp_offset;
  argsCopy[0].fp_offset = in_RDX->fp_offset;
  argsCopy[0].overflow_arg_area = in_RDX->overflow_arg_area;
  SimpleString::SimpleString((SimpleString *)format,"");
  uVar1 = (*PlatformSpecificVSNprintf)(defaultBuffer,100,(char *)args,in_RDX);
  if (uVar1 < 100) {
    SimpleString::SimpleString(&SStack_c8,defaultBuffer);
    SimpleString::operator=((SimpleString *)format,&SStack_c8);
    SimpleString::~SimpleString(&SStack_c8);
    sVar2 = extraout_RDX;
  }
  else {
    sVar2 = (long)(int)uVar1 + 1;
    otherBuffer = SimpleString::allocStringBuffer
                            (sVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
                             ,0x36c);
    (*PlatformSpecificVSNprintf)(otherBuffer,sVar2,(char *)args,argsCopy);
    SimpleString::SimpleString(&SStack_c8,otherBuffer);
    SimpleString::operator=((SimpleString *)format,&SStack_c8);
    SimpleString::~SimpleString(&SStack_c8);
    SimpleString::deallocStringBuffer
              (otherBuffer,sVar2,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O2/CMake/cpputest/cpputest-src/src/CppUTest/SimpleString.cpp"
               ,0x370);
    sVar2 = extraout_RDX_00;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = format;
  return SVar3;
}

Assistant:

SimpleString VStringFromFormat(const char* format, va_list args)
{
    va_list argsCopy;
    va_copy(argsCopy, args);
    enum
    {
        sizeOfdefaultBuffer = 100
    };
    char defaultBuffer[sizeOfdefaultBuffer];
    SimpleString resultString;

    size_t size = (size_t)PlatformSpecificVSNprintf(defaultBuffer, sizeOfdefaultBuffer, format, args);
    if (size < sizeOfdefaultBuffer) {
        resultString = SimpleString(defaultBuffer);
    }
    else {
        size_t newBufferSize = size + 1;
        char* newBuffer = SimpleString::allocStringBuffer(newBufferSize, __FILE__, __LINE__);
        PlatformSpecificVSNprintf(newBuffer, newBufferSize, format, argsCopy);
        resultString = SimpleString(newBuffer);

        SimpleString::deallocStringBuffer(newBuffer, newBufferSize, __FILE__, __LINE__);
    }
    va_end(argsCopy);
    return resultString;
}